

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring_bitmap_add_range_closed(roaring_bitmap_t *r,uint32_t min,uint32_t max)

{
  uint local_64;
  uint32_t local_60;
  uint8_t local_59;
  container_t *pcStack_58;
  uint8_t new_type;
  container_t *new_container;
  uint32_t local_48;
  uint32_t container_max;
  uint32_t container_min;
  uint32_t key;
  int32_t dst;
  int32_t src;
  int32_t common_length;
  int32_t prefix_length;
  int32_t suffix_length;
  int32_t num_required_containers;
  uint32_t max_key;
  uint32_t min_key;
  roaring_array_t *ra;
  uint32_t max_local;
  uint32_t min_local;
  roaring_bitmap_t *r_local;
  
  if (min <= max) {
    num_required_containers = min >> 0x10;
    suffix_length = max >> 0x10;
    prefix_length = (suffix_length - num_required_containers) + 1;
    _max_key = &r->high_low_container;
    ra._0_4_ = max;
    ra._4_4_ = min;
    _max_local = r;
    common_length =
         count_greater((r->high_low_container).keys,(r->high_low_container).size,
                       (uint16_t)(max >> 0x10));
    src = count_less(_max_key->keys,((roaring_array_t *)&_max_key->size)->size - common_length,
                     (uint16_t)num_required_containers);
    dst = (_max_key->size - src) - common_length;
    if (dst < prefix_length) {
      ra_shift_tail(_max_key,common_length,prefix_length - dst);
    }
    key = (src + dst) - 1;
    container_min = _max_key->size - common_length;
    for (container_max = suffix_length; container_min = container_min - 1,
        container_max != num_required_containers - 1U; container_max = container_max - 1) {
      if (num_required_containers == container_max) {
        local_60 = ra._4_4_ & 0xffff;
      }
      else {
        local_60 = 0;
      }
      local_48 = local_60;
      if (suffix_length == container_max) {
        local_64 = (uint32_t)ra & 0xffff;
      }
      else {
        local_64 = 0xffff;
      }
      new_container._4_4_ = local_64;
      if (((int)key < 0) || (_max_key->keys[(int)key] != container_max)) {
        pcStack_58 = container_from_range(&local_59,local_60,local_64 + 1,1);
      }
      else {
        ra_unshare_container_at_index(_max_key,(uint16_t)key);
        pcStack_58 = container_add_range(_max_key->containers[(int)key],
                                         _max_key->typecodes[(int)key],local_48,new_container._4_4_,
                                         &local_59);
        if (pcStack_58 != _max_key->containers[(int)key]) {
          container_free(_max_key->containers[(int)key],_max_key->typecodes[(int)key]);
        }
        key = key - 1;
      }
      ra_replace_key_and_container_at_index
                (_max_key,container_min,(uint16_t)container_max,pcStack_58,local_59);
    }
  }
  return;
}

Assistant:

void roaring_bitmap_add_range_closed(roaring_bitmap_t *r, uint32_t min, uint32_t max) {
    if (min > max) {
        return;
    }

    roaring_array_t *ra = &r->high_low_container;

    uint32_t min_key = min >> 16;
    uint32_t max_key = max >> 16;

    int32_t num_required_containers = max_key - min_key + 1;
    int32_t suffix_length = count_greater(ra->keys, ra->size, max_key);
    int32_t prefix_length = count_less(ra->keys, ra->size - suffix_length,
                                       min_key);
    int32_t common_length = ra->size - prefix_length - suffix_length;

    if (num_required_containers > common_length) {
        ra_shift_tail(ra, suffix_length,
                      num_required_containers - common_length);
    }

    int32_t src = prefix_length + common_length - 1;
    int32_t dst = ra->size - suffix_length - 1;
    for (uint32_t key = max_key; key != min_key-1; key--) { // beware of min_key==0
        uint32_t container_min = (min_key == key) ? (min & 0xffff) : 0;
        uint32_t container_max = (max_key == key) ? (max & 0xffff) : 0xffff;
        container_t* new_container;
        uint8_t new_type;

        if (src >= 0 && ra->keys[src] == key) {
            ra_unshare_container_at_index(ra, src);
            new_container = container_add_range(ra->containers[src],
                                                ra->typecodes[src],
                                                container_min, container_max,
                                                &new_type);
            if (new_container != ra->containers[src]) {
                container_free(ra->containers[src],
                               ra->typecodes[src]);
            }
            src--;
        } else {
            new_container = container_from_range(&new_type, container_min,
                                                 container_max+1, 1);
        }
        ra_replace_key_and_container_at_index(ra, dst, key, new_container,
                                              new_type);
        dst--;
    }
}